

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::setCrash(HDual *this,char *Crash_ArgV)

{
  int iVar1;
  ostream *poVar2;
  char *in_RSI;
  long in_RDI;
  
  iVar1 = strcmp(in_RSI,"Off");
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 8) = 0;
  }
  else {
    iVar1 = strcmp(in_RSI,"LTSSF");
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 8) = 2;
    }
    else {
      iVar1 = strcmp(in_RSI,"LTSSF1");
      if (iVar1 == 0) {
        *(undefined4 *)(in_RDI + 8) = 1;
      }
      else {
        iVar1 = strcmp(in_RSI,"LTSSF2");
        if (iVar1 == 0) {
          *(undefined4 *)(in_RDI + 8) = 2;
        }
        else {
          iVar1 = strcmp(in_RSI,"LTSSF3");
          if (iVar1 == 0) {
            *(undefined4 *)(in_RDI + 8) = 3;
          }
          else {
            iVar1 = strcmp(in_RSI,"LTSSF4");
            if (iVar1 == 0) {
              *(undefined4 *)(in_RDI + 8) = 4;
            }
            else {
              iVar1 = strcmp(in_RSI,"LTSSF5");
              if (iVar1 == 0) {
                *(undefined4 *)(in_RDI + 8) = 5;
              }
              else {
                iVar1 = strcmp(in_RSI,"LTSSF6");
                if (iVar1 == 0) {
                  *(undefined4 *)(in_RDI + 8) = 6;
                }
                else {
                  iVar1 = strcmp(in_RSI,"LTSSF7");
                  if (iVar1 == 0) {
                    *(undefined4 *)(in_RDI + 8) = 7;
                  }
                  else {
                    poVar2 = std::operator<<((ostream *)&std::cout,
                                             "HDual::setCrash unrecognised CrashArgV = ");
                    poVar2 = std::operator<<(poVar2,in_RSI);
                    poVar2 = std::operator<<(poVar2," - using No crash");
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                    *(undefined4 *)(in_RDI + 8) = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void HDual::setCrash(const char *Crash_ArgV) {
  //	cout << "HDual::setCrash Crash_ArgV = " << Crash_ArgV << endl;
	if (strcmp(Crash_ArgV, "Off") == 0)
		Crash_Mode = Crash_Mode_No;
	else if (strcmp(Crash_ArgV, "LTSSF") == 0)
		Crash_Mode = Crash_Mode_Df;
	else if (strcmp(Crash_ArgV, "LTSSF1") == 0)
		Crash_Mode = Crash_Mode_LTSSF_k;
	else if (strcmp(Crash_ArgV, "LTSSF2") == 0)
		Crash_Mode = Crash_Mode_LTSSF_pri;
	else if (strcmp(Crash_ArgV, "LTSSF3") == 0)
		Crash_Mode = Crash_Mode_LTSF_k;
	else if (strcmp(Crash_ArgV, "LTSSF4") == 0)
		Crash_Mode = Crash_Mode_LTSF_pri;
	else if (strcmp(Crash_ArgV, "LTSSF5") == 0)
		Crash_Mode = Crash_Mode_LTSF;
	else if (strcmp(Crash_ArgV, "LTSSF6") == 0)
		Crash_Mode = Crash_Mode_Bixby;
	else if (strcmp(Crash_ArgV, "LTSSF7") == 0)
		Crash_Mode = Crash_Mode_Dev;
	else {
		cout << "HDual::setCrash unrecognised CrashArgV = " << Crash_ArgV
				<< " - using No crash" << endl;
		Crash_Mode = Crash_Mode_No;
	}
//	if (Crash_Mode == Crash_Mode_LTSSF) {
//		crash.ltssf_iz_mode(Crash_Mode);
//	}
//		cout<<"HDual::setCrash Crash_Mode = " << Crash_Mode << endl;
}